

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communication_proxy.cpp
# Opt level: O2

void try_it(IPingable *p)

{
  ostream *poVar1;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_30,"PING",&local_51);
  (*p->_vptr_IPingable[2])(local_50,p,local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,local_50);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void try_it(IPingable& p)
{
	std::cout << p.ping("PING") << std::endl;
}